

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortrc_p.h
# Opt level: O3

float __thiscall QColorTrc::applyExtended(QColorTrc *this,float x)

{
  Type TVar1;
  float fVar2;
  
  TVar1 = this->m_type;
  if (TVar1 == Table) {
    fVar2 = QColorTransferTable::apply(&this->m_table,x);
    return fVar2;
  }
  if (TVar1 != GenericFunction) {
    if (TVar1 == ParameterizedFunction) {
      fVar2 = QColorTransferFunction::apply(&this->m_fun,ABS(x));
      return (float)((uint)ABS(fVar2) | (uint)x & 0x80000000);
    }
    return x;
  }
  fVar2 = (*(this->m_hdr).m_toLinear)(x);
  return fVar2;
}

Assistant:

float applyExtended(float x) const
    {
        switch (m_type) {
        case Type::ParameterizedFunction:
            return std::copysign(fun().apply(std::abs(x)), x);
        case Type::GenericFunction:
            return hdr().apply(x);
        case Type::Table:
            return table().apply(x);
        default:
            break;
        }
        return x;
    }